

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLCopy.cpp
# Opt level: O1

void XPMP2::CSLObj::SetOtherObjCopyResult(bool bResult)

{
  _List_node_base *p_Var1;
  _List_node_base *__n;
  void *__s2;
  _List_node_base *p_Var2;
  int iVar3;
  CSLModel *pCVar4;
  string local_48;
  
  pCVar4 = CSLModelByKey((string *)&gThreadCSLkey_abi_cxx11_,(iterator *)0x0);
  p_Var2 = _DAT_002f0128;
  __s2 = gThreadPath_abi_cxx11_;
  if (pCVar4 == (CSLModel *)0x0) {
    if (3 < glob) {
      return;
    }
    StripXPSysDir(&local_48,(string *)&gThreadPath_abi_cxx11_);
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
           ,0xe1,"SetOtherObjCopyResult",logERR,"Copying %s: CSLModel \'%s\' not found!",
           local_48._M_dataplus._M_p,gThreadCSLkey_abi_cxx11_);
  }
  else {
    p_Var1 = (pCVar4->listObj).super__List_base<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while ((p_Var1 != (_List_node_base *)&pCVar4->listObj &&
           ((__n = p_Var1[3]._M_prev, __n != p_Var2 ||
            ((__n != (_List_node_base *)0x0 &&
             (iVar3 = bcmp(p_Var1[3]._M_next,__s2,(size_t)__n), iVar3 != 0))))))) {
      p_Var1 = p_Var1->_M_next;
    }
    if (p_Var1 != (_List_node_base *)&pCVar4->listObj) {
      SetCopyResult((CSLObj *)(p_Var1 + 1),bResult);
      return;
    }
    if (3 < glob) {
      return;
    }
    StripXPSysDir(&local_48,(string *)&gThreadPath_abi_cxx11_);
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
           ,0xdc,"SetOtherObjCopyResult",logERR,"Copying %s: CSLObj not found in CSLModel \'%s\'!",
           local_48._M_dataplus._M_p,gThreadCSLkey_abi_cxx11_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CSLObj::SetOtherObjCopyResult (bool bResult)
{
    // Look for the CSLObj using the stored CSLId and path
    mapCSLModelTy::iterator cslIter;
    CSLModel* pCsl = CSLModelByKey(gThreadCSLkey);
    if (pCsl) {
        // find the object by path
        listCSLObjTy::iterator iter = std::find_if(pCsl->listObj.begin(),
                                                   pCsl->listObj.end(),
                                                   [](const CSLObj& o)
                                                   { return o.path == gThreadPath; });
        if (iter != pCsl->listObj.end())
            // Did find the CSL object!
            iter->SetCopyResult(bResult);
        else {
            LOG_MSG(logERR, ERR_CPY_OBJ_NOT_FOUND,
                    StripXPSysDir(gThreadPath).c_str(),
                    gThreadCSLkey.c_str());
        }
    } else {
        LOG_MSG(logERR, ERR_CPY_MDL_NOT_FOUND,
                StripXPSysDir(gThreadPath).c_str(),
                gThreadCSLkey.c_str());
    }
}